

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O0

int run_test_get_currentexe(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int64_t eval_b_15;
  int64_t eval_a_15;
  void *eval_b_14;
  void *eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  char *match;
  size_t size;
  char path [4096];
  char buffer [4096];
  
  match = (char *)0x1000;
  iVar1 = uv_exepath(path + 0xff8,&match);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
            ,0x32,"!r");
    abort();
  }
  pcVar2 = realpath(executable_path,(char *)&size);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
            ,0x37,"realpath(executable_path, path)","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(path + 0xff8,(char *)&size);
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(pcVar2,(char *)&size);
    pcVar2 = match;
    if (iVar1 == 0) {
      pcVar3 = (char *)strlen(path + 0xff8);
      if (pcVar2 != pcVar3) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x3f,"size","==","strlen(buffer)",pcVar2,"==",pcVar3);
        abort();
      }
      match = (char *)0x1000;
      iVar1 = uv_exepath(0,&match);
      if ((long)iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x44,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
        abort();
      }
      iVar1 = uv_exepath(path + 0xff8,0);
      if ((long)iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x47,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
        abort();
      }
      match = (char *)0x0;
      iVar1 = uv_exepath(path + 0xff8,&match);
      if ((long)iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x4b,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
        abort();
      }
      memset(path + 0xff8,0xff,0x1000);
      match = (char *)0x1;
      iVar1 = uv_exepath(path + 0xff8,&match);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x51,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      if (match != (char *)0x0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x52,"size","==","0",match,"==",0);
        abort();
      }
      if ((long)path[0xff8] != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x53,"buffer[0]","==","\'\\0\'",(long)path[0xff8],"==",0);
        abort();
      }
      memset(path + 0xff8,0xff,0x1000);
      match = (char *)0x2;
      iVar1 = uv_exepath(path + 0xff8,&match);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x59,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      if (match != (char *)0x1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x5a,"1","==","size",1,"==",match);
        abort();
      }
      if (path[0xff8] == '\0') {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x5b,"buffer[0]","!=","\'\\0\'",0,"!=",0);
        abort();
      }
      if ((long)path[0xff9] != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x5c,"buffer[1]","==","\'\\0\'",(long)path[0xff9],"==",0);
        abort();
      }
      iVar1 = uv_set_process_title("foobar");
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x60,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      match = (char *)0x1000;
      iVar1 = uv_exepath(path + 0xff8,&match);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,99,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      pcVar2 = strstr(path + 0xff8,(char *)&size);
      if (pcVar2 == (char *)0x0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x69,"match","!=","NULL",0,"!=",0);
        abort();
      }
      iVar1 = strcmp(pcVar2,(char *)&size);
      pcVar3 = match;
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x6a,"match","==","path",pcVar2,"==",&size);
        abort();
      }
      pcVar2 = (char *)strlen(path + 0xff8);
      if (pcVar3 != pcVar2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
                ,0x6b,"size","==","strlen(buffer)",pcVar3,"==",pcVar2);
        abort();
      }
      return 0;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
          ,0x3e,"match && !strcmp(match, path)");
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif

  char buffer[PATHMAX];
  char path[PATHMAX];
  size_t size;
  char* match;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

#ifdef _WIN32
  snprintf(path, sizeof(path), "%s", executable_path);
#else
  ASSERT_NOT_NULL(realpath(executable_path, path));
#endif

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT_EQ(size, strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT_EQ(r, UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_OK(size);
  ASSERT_EQ(buffer[0], '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_EQ(1, size);
  ASSERT_NE(buffer[0], '\0');
  ASSERT_EQ(buffer[1], '\0');

  /* Verify uv_exepath is not affected by uv_set_process_title(). */
  r = uv_set_process_title("foobar");
  ASSERT_OK(r);
  size = sizeof(buffer);
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT_NOT_NULL(match);
  ASSERT_STR_EQ(match, path);
  ASSERT_EQ(size, strlen(buffer));
  return 0;
}